

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * google::protobuf::anon_unknown_1::ToJsonName(string *__return_storage_ptr__,string *input)

{
  string *psVar1;
  ulong unaff_RBP;
  ulong uVar2;
  bool bVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    uVar2 = 0;
    do {
      bVar3 = (input->_M_dataplus)._M_p[uVar2] == '_';
      unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),bVar3);
      if (!bVar3) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar2 = uVar2 + 1;
      psVar1 = (string *)(unaff_RBP & 0xffffffff);
    } while (uVar2 < input->_M_string_length);
  }
  return psVar1;
}

Assistant:

std::string ToJsonName(const std::string& input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(input[i]));
      capitalize_next = false;
    } else {
      result.push_back(input[i]);
    }
  }

  return result;
}